

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O0

Point2i __thiscall
CT::MemTracer(CT *this,MemMat<unsigned_char> *img,MemMat<int> *img_labels,Point2i *p,int *i_prev,
             bool *b_isolated)

{
  uchar *puVar1;
  int *piVar2;
  undefined1 *in_stack_00000008;
  Point_<int> local_c8;
  Point_<int> local_c0;
  Point_<int> local_b8;
  Point_<int> local_b0;
  Point_<int> local_a8;
  Point_<int> local_a0;
  Point_<int> local_98;
  Point_<int> local_90;
  Point_<int> local_88;
  Point_<int> local_80;
  Point_<int> local_78;
  Point_<int> local_70;
  Point_<int> local_68;
  Point_<int> local_60;
  Point_<int> local_58;
  Point_<int> local_50;
  Point_<int> local_48;
  Point2i crd_next;
  int i_next;
  int i_first;
  int *i_prev_local;
  Point2i *p_local;
  MemMat<int> *img_labels_local;
  MemMat<unsigned_char> *img_local;
  CT *this_local;
  
  crd_next.x = (*(int *)b_isolated + 2) % 8;
  crd_next.y = crd_next.x;
  cv::Point_<int>::Point_(&local_48);
  do {
    switch(crd_next.x) {
    case 0:
      cv::Point_<int>::Point_(&local_58,1,0);
      cv::operator+((cv *)&local_50,(Point_<int> *)i_prev,&local_58);
      cv::Point_<int>::operator=(&local_48,&local_50);
      break;
    case 1:
      cv::Point_<int>::Point_(&local_68,1,1);
      cv::operator+((cv *)&local_60,(Point_<int> *)i_prev,&local_68);
      cv::Point_<int>::operator=(&local_48,&local_60);
      break;
    case 2:
      cv::Point_<int>::Point_(&local_78,0,1);
      cv::operator+((cv *)&local_70,(Point_<int> *)i_prev,&local_78);
      cv::Point_<int>::operator=(&local_48,&local_70);
      break;
    case 3:
      cv::Point_<int>::Point_(&local_88,-1,1);
      cv::operator+((cv *)&local_80,(Point_<int> *)i_prev,&local_88);
      cv::Point_<int>::operator=(&local_48,&local_80);
      break;
    case 4:
      cv::Point_<int>::Point_(&local_98,-1,0);
      cv::operator+((cv *)&local_90,(Point_<int> *)i_prev,&local_98);
      cv::Point_<int>::operator=(&local_48,&local_90);
      break;
    case 5:
      cv::Point_<int>::Point_(&local_a8,-1,-1);
      cv::operator+((cv *)&local_a0,(Point_<int> *)i_prev,&local_a8);
      cv::Point_<int>::operator=(&local_48,&local_a0);
      break;
    case 6:
      cv::Point_<int>::Point_(&local_b8,0,-1);
      cv::operator+((cv *)&local_b0,(Point_<int> *)i_prev,&local_b8);
      cv::Point_<int>::operator=(&local_48,&local_b0);
      break;
    case 7:
      cv::Point_<int>::Point_(&local_c8,1,-1);
      cv::operator+((cv *)&local_c0,(Point_<int> *)i_prev,&local_c8);
      cv::Point_<int>::operator=(&local_48,&local_c0);
    }
    if ((((-1 < local_48.y) && (-1 < local_48.x)) && (local_48.y < img_labels->rows)) &&
       (local_48.x < img_labels->cols)) {
      puVar1 = MemMat<unsigned_char>::operator()
                         ((MemMat<unsigned_char> *)img_labels,local_48.y,local_48.x);
      if (*puVar1 == (img->accesses_).field_0xc) {
        *(int *)b_isolated = (crd_next.x + 4) % 8;
        cv::Point_<int>::Point_((Point_<int> *)this,&local_48);
        return (Point2i)this;
      }
      piVar2 = MemMat<int>::operator()((MemMat<int> *)p,local_48.y,local_48.x);
      *piVar2 = -1;
    }
    crd_next.x = (crd_next.x + 1) % 8;
  } while (crd_next.x != crd_next.y);
  *in_stack_00000008 = 1;
  cv::Point_<int>::Point_((Point_<int> *)this,(Point_<int> *)i_prev);
  return (Point2i)this;
}

Assistant:

cv::Point2i MemTracer(MemMat<unsigned char> &img, MemMat<int> &img_labels, const cv::Point2i &p, int &i_prev, bool &b_isolated) {
        int i_first, i_next;

        // Find the direction to be analyzed
        i_first = i_next = (i_prev + 2) % 8;

        cv::Point2i crd_next;
        do {
            switch (i_next) {
            case 0: crd_next = p + cv::Point2i(1, 0); break;
            case 1: crd_next = p + cv::Point2i(1, 1); break;
            case 2: crd_next = p + cv::Point2i(0, 1); break;
            case 3: crd_next = p + cv::Point2i(-1, 1); break;
            case 4: crd_next = p + cv::Point2i(-1, 0); break;
            case 5: crd_next = p + cv::Point2i(-1, -1); break;
            case 6: crd_next = p + cv::Point2i(0, -1); break;
            case 7: crd_next = p + cv::Point2i(1, -1); break;
            }

            if (crd_next.y >= 0 && crd_next.x >= 0 && crd_next.y < img.rows && crd_next.x < img.cols) {
                if (img(crd_next.y, crd_next.x) == byF) {
                    i_prev = (i_next + 4) % 8;
                    return crd_next;
                }
                else
                    img_labels(crd_next.y, crd_next.x) = -1;
            }

            i_next = (i_next + 1) % 8;
        } while (i_next != i_first);

        b_isolated = true;
        return p;
    }